

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-list.c
# Opt level: O3

void test_list_insert(void)

{
  undefined8 *puVar1;
  long lVar2;
  long *plVar3;
  undefined4 *puVar4;
  undefined4 *puVar5;
  uint cond;
  long *plVar6;
  int iVar7;
  long *local_58;
  long *local_50;
  undefined4 local_48;
  long *local_40;
  long *local_38;
  
  local_50 = (long *)&local_58;
  local_58 = (long *)&local_58;
  puVar4 = (undefined4 *)malloc(0x18);
  acutest_check_((uint)(puVar4 != (undefined4 *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                 ,0x2d,"%s","d != NULL");
  *puVar4 = 5;
  *(long **)(puVar4 + 2) = local_58;
  *(long ***)(puVar4 + 4) = &local_58;
  plVar6 = local_58 + 1;
  local_58 = (long *)(puVar4 + 2);
  *plVar6 = (long)(puVar4 + 2);
  puVar4 = (undefined4 *)malloc(0x18);
  acutest_check_((uint)(puVar4 != (undefined4 *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                 ,0x2d,"%s","d != NULL");
  *puVar4 = 2;
  plVar6 = (long *)(puVar4 + 2);
  *(long ***)(puVar4 + 2) = &local_58;
  *(long **)(puVar4 + 4) = local_50;
  plVar3 = plVar6;
  *local_50 = (long)plVar6;
  local_50 = plVar3;
  puVar5 = (undefined4 *)malloc(0x18);
  acutest_check_((uint)(puVar5 != (undefined4 *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                 ,0x2d,"%s","d != NULL");
  plVar3 = local_50;
  *puVar5 = 3;
  *(long **)(puVar5 + 2) = plVar6;
  puVar1 = *(undefined8 **)(puVar4 + 4);
  *(undefined8 **)(puVar5 + 4) = puVar1;
  *(undefined4 **)(puVar4 + 4) = puVar5 + 2;
  *puVar1 = puVar5 + 2;
  puVar4 = (undefined4 *)malloc(0x18);
  acutest_check_((uint)(puVar4 != (undefined4 *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                 ,0x2d,"%s","d != NULL");
  plVar6 = local_58;
  *puVar4 = 1;
  lVar2 = *plVar3;
  *(long *)(puVar4 + 2) = lVar2;
  *(long **)(puVar4 + 4) = plVar3;
  *plVar3 = (long)(puVar4 + 2);
  *(undefined4 **)(lVar2 + 8) = puVar4 + 2;
  puVar4 = (undefined4 *)malloc(0x18);
  acutest_check_((uint)(puVar4 != (undefined4 *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                 ,0x2d,"%s","d != NULL");
  plVar3 = local_58;
  *puVar4 = 4;
  lVar2 = *plVar6;
  *(long *)(puVar4 + 2) = lVar2;
  *(long **)(puVar4 + 4) = plVar6;
  *plVar6 = (long)(puVar4 + 2);
  *(undefined4 **)(lVar2 + 8) = puVar4 + 2;
  puVar4 = (undefined4 *)malloc(0x18);
  acutest_check_((uint)(puVar4 != (undefined4 *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                 ,0x2d,"%s","d != NULL");
  *puVar4 = 6;
  *(long **)(puVar4 + 2) = plVar3;
  puVar1 = (undefined8 *)plVar3[1];
  *(undefined8 **)(puVar4 + 4) = puVar1;
  plVar3[1] = (long)(puVar4 + 2);
  *puVar1 = puVar4 + 2;
  local_48 = 0x29a;
  local_58[1] = (long)&local_58;
  *local_50 = (long)&local_58;
  local_40 = local_50;
  local_38 = (long *)local_50[1];
  local_50[1] = (long)&local_40;
  *local_38 = (long)&local_40;
  local_50[1] = (long)local_38;
  *local_38 = (long)local_50;
  if ((long **)local_50 != &local_58) {
    iVar7 = 1;
    plVar6 = local_50;
    do {
      acutest_check_((uint)(iVar7 == (int)plVar6[-1]),
                     "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                     ,0x83,"%s","data->value == n");
      plVar6 = (long *)plVar6[1];
      iVar7 = iVar7 + 1;
    } while ((long **)plVar6 != &local_58);
  }
  if ((long **)local_58 != &local_58) {
    iVar7 = 6;
    plVar6 = local_58;
    do {
      acutest_check_((uint)(iVar7 == (int)plVar6[-1]),
                     "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                     ,0x89,"%s","data->value == n");
      iVar7 = iVar7 + -1;
      plVar6 = (long *)*plVar6;
    } while ((long **)plVar6 != &local_58);
  }
  if ((long **)local_50 == &local_58) {
    cond = 0;
  }
  else {
    iVar7 = 6;
    do {
      lVar2 = *local_50;
      plVar6 = (long *)local_50[1];
      *(long **)(lVar2 + 8) = plVar6;
      *plVar6 = lVar2;
      free(local_50 + -1);
      iVar7 = iVar7 + -1;
    } while ((long **)local_50 != &local_58);
    cond = (uint)(iVar7 == 0);
  }
  acutest_check_(cond,
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                 ,0x94,"%s","n == 6");
  return;
}

Assistant:

static void
test_list_insert(void)
{
    LIST list;
    LIST_NODE* node;
    DATA* data;
    DATA xxx;
    int n;

    /* Create simple list. */
    list_init(&list);
    list_append(&list, &alloc_data(5)->list_node);                              /* 5 */
    list_prepend(&list, &alloc_data(2)->list_node);                             /* 2 -> 5 */
    list_insert_after(&list, list_head(&list), &alloc_data(3)->list_node);      /* 1 -> 2 -> 3 */
    list_insert_before(&list, list_head(&list), &alloc_data(1)->list_node);     /* 1 -> 2 -> 3 -> 5 */
    list_insert_before(&list, list_tail(&list), &alloc_data(4)->list_node);     /* 1 -> 2 -> 3 -> 4 -> 5 */
    list_insert_after(&list, list_tail(&list), &alloc_data(6)->list_node);      /* 1 -> 2 -> 3 -> 4 -> 5 -> 6 */

    /* Verify that removals do not break integrity. */
    xxx.value = 666;
    list_append(&list, &xxx.list_node);
    list_remove(&list, &xxx.list_node);
    list_prepend(&list, &xxx.list_node);
    list_remove(&list, &xxx.list_node);
    list_insert_after(&list, list_head(&list), &xxx.list_node);
    list_remove(&list, &xxx.list_node);

    /* Iterate forward. */
    for(node = list_head(&list), n = 1; node != list_end(&list); node = list_next(node), n++) {
        data = LIST_DATA(node, DATA, list_node);
        TEST_CHECK(data->value == n);
    }

    /* Iterate backward. */
    for(node = list_tail(&list), n = 6; node != list_end(&list); node = list_prev(node), n--) {
        data = LIST_DATA(node, DATA, list_node);
        TEST_CHECK(data->value == n);
    }

    /* Clean up. */
    n = 0;
    while(!list_is_empty(&list)) {
        node = list_head(&list);
        list_remove(&list, node);
        free(LIST_DATA(node, DATA, list_node));
        n++;
    }
    TEST_CHECK(n == 6);
}